

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void xmlHashScanFull3(xmlHashTablePtr table,xmlChar *name,xmlChar *name2,xmlChar *name3,
                     xmlHashScannerFull f,void *data)

{
  _xmlHashEntry *p_Var1;
  int iVar2;
  xmlHashEntryPtr next;
  xmlHashEntryPtr iter;
  int i;
  void *data_local;
  xmlHashScannerFull f_local;
  xmlChar *name3_local;
  xmlChar *name2_local;
  xmlChar *name_local;
  xmlHashTablePtr table_local;
  
  if (((table != (xmlHashTablePtr)0x0) && (f != (xmlHashScannerFull)0x0)) &&
     (table->table != (_xmlHashEntry *)0x0)) {
    for (iter._4_4_ = 0; iter._4_4_ < table->size; iter._4_4_ = iter._4_4_ + 1) {
      if (table->table[iter._4_4_].valid != 0) {
        p_Var1 = table->table + iter._4_4_;
        while (next = p_Var1, next != (xmlHashEntryPtr)0x0) {
          p_Var1 = next->next;
          if (((((name == (xmlChar *)0x0) || (iVar2 = xmlStrEqual(name,next->name), iVar2 != 0)) &&
               ((name2 == (xmlChar *)0x0 || (iVar2 = xmlStrEqual(name2,next->name2), iVar2 != 0))))
              && ((name3 == (xmlChar *)0x0 || (iVar2 = xmlStrEqual(name3,next->name3), iVar2 != 0)))
              ) && (next->payload != (void *)0x0)) {
            (*f)(next->payload,data,next->name,next->name2,next->name3);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
xmlHashScanFull3(xmlHashTablePtr table, const xmlChar *name,
		 const xmlChar *name2, const xmlChar *name3,
		 xmlHashScannerFull f, void *data) {
    int i;
    xmlHashEntryPtr iter;
    xmlHashEntryPtr next;

    if (table == NULL)
	return;
    if (f == NULL)
	return;

    if (table->table) {
	for(i = 0; i < table->size; i++) {
	    if (table->table[i].valid == 0)
		continue;
	    iter = &(table->table[i]);
	    while (iter) {
		next = iter->next;
		if (((name == NULL) || (xmlStrEqual(name, iter->name))) &&
		    ((name2 == NULL) || (xmlStrEqual(name2, iter->name2))) &&
		    ((name3 == NULL) || (xmlStrEqual(name3, iter->name3))) &&
		    (iter->payload != NULL)) {
		    f(iter->payload, data, iter->name,
		      iter->name2, iter->name3);
		}
		iter = next;
	    }
	}
    }
}